

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_check_privkey(mbedtls_ecp_group *grp,mbedtls_mpi *d)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = -0x4f80;
  }
  else if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    iVar2 = mbedtls_mpi_get_bit(d,0);
    iVar1 = -0x4c80;
    if (((iVar2 == 0) && (iVar2 = mbedtls_mpi_get_bit(d,1), iVar2 == 0)) &&
       (iVar2 = mbedtls_mpi_get_bit(d,2), iVar2 == 0)) {
      sVar3 = mbedtls_mpi_bitlen(d);
      iVar1 = -0x4c80;
      if (sVar3 - 1 == grp->nbits) {
        iVar1 = 0;
      }
    }
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(d,1);
    if (iVar1 < 0) {
      iVar1 = -0x4c80;
    }
    else {
      iVar2 = mbedtls_mpi_cmp_mpi(d,&grp->N);
      iVar1 = -0x4c80;
      if (iVar2 < 0) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_check_privkey( const mbedtls_ecp_group *grp, const mbedtls_mpi *d )
{
#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* see [Curve25519] page 5 */
        if( mbedtls_mpi_get_bit( d, 0 ) != 0 ||
            mbedtls_mpi_get_bit( d, 1 ) != 0 ||
            mbedtls_mpi_get_bit( d, 2 ) != 0 ||
            mbedtls_mpi_bitlen( d ) - 1 != grp->nbits ) /* mbedtls_mpi_bitlen is one-based! */
            return( MBEDTLS_ERR_ECP_INVALID_KEY );
        else
            return( 0 );
    }
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* see SEC1 3.2 */
        if( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
            mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 )
            return( MBEDTLS_ERR_ECP_INVALID_KEY );
        else
            return( 0 );
    }
#endif /* ECP_SHORTWEIERSTRASS */

    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}